

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution3d.cpp
# Opt level: O2

int __thiscall
ncnn::Deconvolution3D::forward(Deconvolution3D *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  size_t sVar11;
  int *piVar12;
  void *pvVar13;
  size_t sVar14;
  size_t sVar15;
  void *pvVar16;
  float *pfVar17;
  uint uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined8 uVar23;
  undefined4 in_EAX;
  int iVar24;
  uint uVar25;
  int iVar26;
  ulong uVar27;
  int iVar28;
  long lVar29;
  int iVar30;
  int iVar31;
  ulong uVar32;
  int iVar33;
  Deconvolution3D *this_00;
  int iVar34;
  int iVar35;
  uint uVar36;
  ulong uVar37;
  uint uVar38;
  void *pvVar39;
  long lVar40;
  ulong uVar41;
  ulong uVar42;
  int k;
  ulong uVar43;
  int i;
  ulong uVar44;
  ulong uVar45;
  bool bVar46;
  undefined4 uVar47;
  float fVar48;
  undefined1 auVar49 [16];
  float fVar50;
  float fVar51;
  int local_170;
  allocator_type local_169;
  ulong local_168;
  Deconvolution3D *local_160;
  void *local_158;
  ulong local_150;
  ulong local_148;
  void *local_140;
  undefined1 local_138 [16];
  Mat *local_128;
  long local_120;
  Mat local_118;
  ulong local_d0;
  int local_c4;
  int local_c0;
  int local_bc;
  long local_b8;
  Mat *local_b0;
  Option *local_a8;
  void *local_a0;
  void *local_98;
  ulong local_90;
  long local_88;
  size_t local_80;
  long local_78;
  void *local_70;
  ulong local_68;
  ulong local_60;
  long local_58;
  long local_50;
  vector<int,_std::allocator<int>_> _space_ofs;
  
  uVar23 = local_138._0_8_;
  iVar31 = bottom_blob->w;
  iVar26 = bottom_blob->h;
  iVar2 = bottom_blob->d;
  iVar3 = this->kernel_w;
  iVar4 = this->dilation_w;
  sVar11 = bottom_blob->elemsize;
  iVar5 = this->stride_w;
  iVar6 = this->kernel_h;
  iVar28 = this->dilation_h;
  iVar7 = this->stride_h;
  iVar33 = this->kernel_d;
  iVar30 = this->dilation_d;
  iVar34 = this->stride_d;
  iVar35 = this->output_pad_right;
  iVar8 = this->output_pad_bottom;
  iVar9 = this->output_pad_behind;
  local_118.cstep = 0;
  local_118.data = (void *)0x0;
  local_118.refcount._0_4_ = 0;
  local_118.refcount._4_4_ = 0;
  local_118.elemsize = 0;
  local_118.elempack = 0;
  local_118.allocator = (Allocator *)0x0;
  local_118.dims = 0;
  local_118.w = 0;
  local_118.h = 0;
  local_118.d = 0;
  local_118.c = 0;
  auVar49._0_4_ = -(uint)(0 < this->pad_left);
  auVar49._4_4_ = -(uint)(0 < this->pad_right);
  auVar49._8_4_ = -(uint)(0 < this->pad_top);
  auVar49._12_4_ = -(uint)(0 < this->pad_bottom);
  iVar24 = movmskps(in_EAX,auVar49);
  local_138._8_8_ = local_138._0_8_;
  local_138._0_8_ = 0x10;
  if (((((iVar24 == 0) && (this->pad_front < 1)) && (this->pad_behind < 1)) &&
      (((this->output_w < 1 || (this->output_h < 1)) || (this->output_d < 1)))) &&
     (local_138._8_8_ = uVar23, local_138._0_8_ = 8, &local_118 != top_blob)) {
    piVar12 = top_blob->refcount;
    if (piVar12 != (int *)0x0) {
      LOCK();
      *piVar12 = *piVar12 + 1;
      UNLOCK();
    }
    local_118.data = top_blob->data;
    local_118.refcount._0_4_ = SUB84(top_blob->refcount,0);
    local_118.refcount._4_4_ = (undefined4)((ulong)top_blob->refcount >> 0x20);
    local_118.elemsize = top_blob->elemsize;
    local_118.elempack = top_blob->elempack;
    local_118.allocator = top_blob->allocator;
    uVar19 = top_blob->dims;
    uVar20 = top_blob->w;
    uVar21 = top_blob->h;
    uVar22 = top_blob->d;
    local_118.c = top_blob->c;
    local_118.cstep = top_blob->cstep;
    local_118.dims = uVar19;
    local_118.w = uVar20;
    local_118.h = uVar21;
    local_118.d = uVar22;
  }
  local_160 = this;
  local_128 = top_blob;
  local_b0 = bottom_blob;
  local_a8 = opt;
  Mat::create(&local_118,iVar35 + (iVar3 + -1) * iVar4 + (iVar31 + -1) * iVar5 + 1,
              iVar8 + 1 + (iVar6 + -1) * iVar28 + (iVar26 + -1) * iVar7,
              iVar9 + 1 + (iVar33 + -1) * iVar30 + (iVar2 + -1) * iVar34,this->num_output,sVar11,
              *(Allocator **)(&opt->lightmode + local_138._0_8_));
  iVar26 = local_118.h;
  iVar31 = -100;
  if ((local_118.data != (void *)0x0) &&
     (local_d0 = (ulong)local_118.c, local_118.cstep * local_d0 != 0)) {
    iVar31 = local_160->kernel_w;
    iVar2 = local_160->kernel_h;
    local_120 = (long)local_160->stride_w;
    local_138._0_8_ = (long)local_160->stride_h;
    local_158 = (void *)(long)local_160->stride_d;
    iVar3 = local_160->dilation_w;
    iVar4 = local_160->dilation_h;
    iVar5 = local_160->dilation_d;
    local_168 = (ulong)(uint)local_160->activation_type;
    local_150 = CONCAT44(local_150._4_4_,local_118.w);
    local_148 = CONCAT44(local_148._4_4_,local_160->kernel_d);
    uVar25 = iVar2 * iVar31 * local_160->kernel_d;
    std::vector<int,_std::allocator<int>_>::vector(&_space_ofs,(long)(int)uVar25,&local_169);
    iVar28 = 0;
    iVar6 = iVar31;
    if (iVar31 < 1) {
      iVar6 = iVar28;
    }
    iVar7 = iVar2;
    if (iVar2 < 1) {
      iVar7 = iVar28;
    }
    if ((int)local_148 < 1) {
      local_148._0_4_ = iVar28;
    }
    iVar30 = 0;
    iVar33 = 0;
    for (; iVar28 != (int)local_148; iVar28 = iVar28 + 1) {
      iVar34 = iVar33;
      for (iVar35 = 0; iVar34 = iVar6 + iVar34, iVar35 != iVar7; iVar35 = iVar35 + 1) {
        for (lVar40 = (long)iVar33; iVar34 != lVar40; lVar40 = lVar40 + 1) {
          _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar40] = iVar30;
          iVar30 = iVar30 + iVar3;
        }
        iVar30 = iVar30 + ((int)local_150 * iVar4 - iVar3 * iVar31);
        iVar33 = iVar33 + iVar6;
      }
      iVar30 = iVar30 + (iVar26 * iVar5 - iVar4 * iVar2) * (int)local_150;
    }
    local_b8 = local_118.cstep * local_118.elemsize;
    local_88 = (long)local_118.h * (long)local_118.w;
    local_90 = local_118.elemsize * local_88 + 0xf & 0xfffffffffffffff0;
    local_a0 = (local_160->bias_data).data;
    bVar46 = local_a0 != (void *)0x0;
    iVar31 = (local_160->bias_data).c;
    sVar11 = (local_160->bias_data).cstep;
    uVar10 = local_b0->c;
    local_bc = local_118.d;
    uVar36 = local_118.h * local_118.w * local_118.d;
    uVar38 = 0;
    uVar32 = 0;
    if (0 < (int)uVar25) {
      uVar32 = (ulong)uVar25;
    }
    uVar42 = 0;
    if (0 < (int)uVar10) {
      uVar42 = (ulong)uVar10;
    }
    uVar18 = local_b0->w;
    if (local_b0->w < 1) {
      uVar18 = uVar38;
    }
    local_148 = (ulong)uVar18;
    uVar18 = local_b0->h;
    if (local_b0->h < 1) {
      uVar18 = uVar38;
    }
    local_150 = (ulong)uVar18;
    uVar18 = local_b0->d;
    if (local_b0->d < 1) {
      uVar18 = uVar38;
    }
    local_68 = (ulong)uVar18;
    if ((int)uVar36 < 1) {
      uVar36 = uVar38;
    }
    local_60 = (ulong)uVar36;
    iVar26 = (int)local_d0;
    local_d0 = local_d0 & 0xffffffff;
    if (iVar26 < 1) {
      local_d0 = 0;
    }
    local_78 = local_118.elemsize * local_88 * (long)local_158;
    local_80 = local_118.elemsize;
    local_58 = (long)local_118.w * local_118.elemsize * local_138._0_8_;
    local_c0 = uVar10 * uVar25;
    uVar27 = (ulong)((int)local_168 - 1);
    local_c4 = local_118.dims;
    local_170 = 0;
    local_98 = local_118.data;
    local_140 = local_118.data;
    this_00 = local_160;
    local_168 = uVar27;
    for (uVar37 = 0; uVar37 != local_d0; uVar37 = uVar37 + 1) {
      iVar26 = (int)(local_90 / local_80);
      if (local_c4 == 4) {
        iVar26 = (int)local_88;
      }
      uVar47 = 0;
      if ((long)iVar31 * sVar11 != 0 && bVar46) {
        uVar47 = *(undefined4 *)((long)local_a0 + uVar37 * 4);
      }
      local_50 = (long)local_170 * 4;
      local_70 = (void *)(local_b8 * uVar37 + (long)local_98);
      iVar26 = iVar26 * local_bc;
      if (iVar26 < 1) {
        iVar26 = 0;
      }
      for (lVar40 = 0; iVar26 != (int)lVar40; lVar40 = lVar40 + 1) {
        *(undefined4 *)((long)local_140 + lVar40 * 4) = uVar47;
      }
      for (uVar45 = 0; uVar45 != local_68; uVar45 = uVar45 + 1) {
        local_158 = (void *)(local_78 * uVar45 + (long)local_70);
        for (uVar27 = 0; uVar27 != local_150; uVar27 = uVar27 + 1) {
          local_138._0_8_ = uVar27;
          pvVar13 = (this_00->weight_data).data;
          for (uVar41 = 0; uVar41 != local_148; uVar41 = uVar41 + 1) {
            lVar40 = uVar41 * local_120 * 4 + local_58 * uVar27;
            iVar26 = local_b0->h;
            sVar14 = local_b0->elemsize;
            sVar15 = local_b0->cstep;
            lVar29 = (long)local_b0->w * sVar14;
            pvVar16 = local_b0->data;
            pvVar39 = (void *)((long)pvVar13 + local_50);
            for (uVar44 = 0; uVar44 != uVar42; uVar44 = uVar44 + 1) {
              fVar48 = *(float *)((long)pvVar16 +
                                 sVar15 * sVar14 * uVar44 +
                                 uVar41 * 4 + lVar29 * uVar27 + (long)iVar26 * uVar45 * lVar29);
              for (uVar43 = 0; uVar32 != uVar43; uVar43 = uVar43 + 1) {
                *(float *)((long)local_158 +
                          (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start[uVar43] * 4 + lVar40) =
                     *(float *)((long)pvVar39 + uVar43 * 4) * fVar48 +
                     *(float *)((long)local_158 +
                               (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_start[uVar43] * 4 + lVar40);
              }
              pvVar39 = (void *)((long)pvVar39 + (long)(int)uVar25 * 4);
            }
          }
          this_00 = local_160;
        }
        uVar27 = local_168;
      }
      pfVar17 = (float *)(this_00->activation_params).data;
      for (uVar45 = 0; local_60 != uVar45; uVar45 = uVar45 + 1) {
        fVar48 = *(float *)((long)local_140 + uVar45 * 4);
        fVar51 = fVar48;
        if ((uint)uVar27 < 6) {
          switch((long)&switchD_004c70dd::switchdataD_004df358 +
                 (long)(int)(&switchD_004c70dd::switchdataD_004df358)[uVar27]) {
          case 0x4c70df:
            if (fVar48 <= 0.0) {
              fVar51 = 0.0;
            }
            break;
          case 0x4c70ef:
            local_138 = ZEXT416((uint)fVar48);
            fVar48 = expf(fVar48);
            fVar48 = logf(fVar48 + 1.0);
            fVar48 = tanhf(fVar48);
            this_00 = local_160;
            uVar27 = local_168;
            fVar51 = fVar48 * (float)local_138._0_4_;
            break;
          case 0x4c7128:
            if (fVar48 <= *pfVar17) {
              fVar48 = *pfVar17;
            }
            fVar51 = pfVar17[1];
            if (fVar48 <= pfVar17[1]) {
              fVar51 = fVar48;
            }
            break;
          case 0x4c7144:
            if (88.37626 <= fVar48) {
              fVar48 = 88.37626;
            }
            fVar48 = expf((float)(-(uint)(fVar48 < -88.37626) & 0x42b0c0a5 |
                                 ~-(uint)(fVar48 < -88.37626) & (uint)-fVar48));
            this_00 = local_160;
            uVar27 = local_168;
            fVar51 = 1.0 / (fVar48 + 1.0);
            break;
          case 0x4c719b:
            fVar51 = (float)(~-(uint)(0.0 < fVar48) & (uint)*pfVar17 |
                            -(uint)(0.0 < fVar48) & 0x3f800000) * fVar48;
            break;
          case 0x4c71c3:
            fVar1 = *pfVar17;
            fVar50 = -pfVar17[1] / fVar1;
            fVar51 = 0.0;
            if ((fVar50 <= fVar48) && (fVar51 = fVar48, fVar48 <= fVar50 + 1.0 / fVar1)) {
              fVar51 = (fVar1 * fVar48 + pfVar17[1]) * fVar48;
            }
          }
        }
        *(float *)((long)local_140 + uVar45 * 4) = fVar51;
      }
      local_140 = (void *)((long)local_140 + local_b8);
      local_170 = local_170 + local_c0;
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&_space_ofs.super__Vector_base<int,_std::allocator<int>_>);
    cut_padding(this_00,&local_118,local_128,local_a8);
    if ((local_128->data == (void *)0x0) || (iVar31 = 0, (long)local_128->c * local_128->cstep == 0)
       ) {
      iVar31 = -100;
    }
  }
  piVar12 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
  if (piVar12 != (int *)0x0) {
    LOCK();
    *piVar12 = *piVar12 + -1;
    UNLOCK();
    if (*piVar12 == 0) {
      if (local_118.allocator == (Allocator *)0x0) {
        free(local_118.data);
      }
      else {
        (*(local_118.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar31;
}

Assistant:

int Deconvolution3D::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    size_t elemsize = bottom_blob.elemsize;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;
    const int kernel_extent_d = dilation_d * (kernel_d - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w + output_pad_right;
    int outh = (h - 1) * stride_h + kernel_extent_h + output_pad_bottom;
    int outd = (d - 1) * stride_d + kernel_extent_d + output_pad_behind;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0 || pad_front > 0 || pad_behind > 0 || (output_w > 0 && output_h > 0 && output_d > 0))
    {
        top_blob_bordered.create(outw, outh, outd, num_output, elemsize, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, outd, num_output, elemsize, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    int ret = deconvolution3d(bottom_blob, top_blob_bordered, weight_data, bias_data, kernel_w, kernel_h, kernel_d, stride_w, stride_h, stride_d, dilation_w, dilation_h, dilation_d, activation_type, activation_params, opt);
    if (ret != 0)
        return ret;

    cut_padding(top_blob_bordered, top_blob, opt);
    if (top_blob.empty())
        return -100;

    return 0;
}